

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O2

void __thiscall
bgui::ListImageWindow::ListImageWindow
          (ListImageWindow *this,double init_min,double init_max,double valid_min,double valid_max,
          keep k,mapping m,int c)

{
  string local_1b8;
  ostringstream local_198 [376];
  
  ImageWindow::ImageWindow(&this->super_ImageWindow);
  (this->super_ImageWindow).super_BaseWindow._vptr_BaseWindow =
       (_func_int **)&PTR__ListImageWindow_00122af8;
  (this->name).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->name).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->list).
  super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).
  super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).
  super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"\n");
  std::operator<<((ostream *)local_198,"List:\n");
  std::operator<<((ostream *)local_198,"<cursor left>  Load previous image\n");
  std::operator<<((ostream *)local_198,"<cursor right> Load next image\n");
  std::operator<<((ostream *)local_198,
                  "\'k\'            Switch between keep, keep_all and not keeping the settings when changing between images\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  ImageWindow::addHelpText(&this->super_ImageWindow,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  this->current = 0;
  this->imin = init_min;
  this->imax = init_max;
  this->vmin = valid_min;
  this->vmax = valid_max;
  this->kp = k;
  this->map = m;
  this->channel = c;
  updateTitle(this);
  return;
}

Assistant:

ListImageWindow::ListImageWindow(double init_min, double init_max,
                                 double valid_min, double valid_max, keep k, mapping m, int c)
{
  addHelpText(createHelpText());

  current=0;

  imin=init_min;
  imax=init_max;
  vmin=valid_min;
  vmax=valid_max;
  kp=k;
  map=m;
  channel=c;

  set(-1, 0, 0, false);
}